

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O1

Acec_Box_t * Acec_CreateBox(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vTree)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  Vec_Bit_t *vVisit;
  int *__s;
  int *__ptr;
  void *__s_00;
  int *__ptr_00;
  byte *__s_01;
  Acec_Box_t *pAVar11;
  Vec_Wec_t *vBoxes;
  Vec_Int_t *pVVar12;
  Vec_Wec_t *pVVar13;
  Vec_Wec_t *pVVar14;
  Vec_Int_t *pVVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  size_t sVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  
  uVar16 = 0;
  if (1 < (long)vTree->nSize) {
    uVar16 = 0;
    uVar19 = 1;
    do {
      if ((int)uVar16 <= vTree->pArray[uVar19]) {
        uVar16 = vTree->pArray[uVar19];
      }
      uVar19 = uVar19 + 2;
    } while (uVar19 < (ulong)(long)vTree->nSize);
  }
  uVar10 = vAdds->nSize / 6;
  iVar18 = (((int)uVar10 >> 5) + 1) - (uint)((uVar10 & 0x1f) == 0);
  vVisit = (Vec_Bit_t *)malloc(0x10);
  vVisit->nSize = 0;
  vVisit->nCap = iVar18 * 0x20;
  if (iVar18 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar18 * 4);
  }
  vVisit->pArray = __s;
  vVisit->nSize = iVar18 * 0x20;
  memset(__s,0,(long)iVar18 << 2);
  iVar24 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  __ptr = (int *)malloc(0x10);
  __ptr[1] = 0;
  iVar18 = iVar24 * 0x20;
  *__ptr = iVar18;
  if (iVar24 == 0) {
    __s_00 = (void *)0x0;
  }
  else {
    __s_00 = malloc((long)iVar24 * 4);
  }
  *(void **)(__ptr + 2) = __s_00;
  __ptr[1] = iVar18;
  sVar20 = (long)iVar24 * 4;
  memset(__s_00,0,sVar20);
  __ptr_00 = (int *)malloc(0x10);
  __ptr_00[1] = 0;
  *__ptr_00 = iVar18;
  if (iVar24 == 0) {
    __s_01 = (byte *)0x0;
  }
  else {
    __s_01 = (byte *)malloc(sVar20);
  }
  *(byte **)(__ptr_00 + 2) = __s_01;
  __ptr_00[1] = iVar18;
  memset(__s_01,0,sVar20);
  lVar22 = 1;
  pAVar11 = (Acec_Box_t *)calloc(1,0x30);
  pAVar11->pGia = p;
  uVar10 = uVar16 + 1;
  vBoxes = (Vec_Wec_t *)malloc(0x10);
  sVar20 = (size_t)uVar10;
  if (uVar16 < 7) {
    sVar20 = 8;
  }
  vBoxes->nSize = 0;
  vBoxes->nCap = (int)sVar20;
  pVVar12 = (Vec_Int_t *)calloc(sVar20,0x10);
  vBoxes->pArray = pVVar12;
  vBoxes->nSize = uVar10;
  pAVar11->vAdds = vBoxes;
  pVVar13 = (Vec_Wec_t *)malloc(0x10);
  pVVar13->nSize = 0;
  pVVar13->nCap = (int)sVar20;
  pVVar12 = (Vec_Int_t *)calloc(sVar20,0x10);
  pVVar13->pArray = pVVar12;
  pVVar13->nSize = uVar10;
  pAVar11->vLeafLits = pVVar13;
  pVVar14 = (Vec_Wec_t *)malloc(0x10);
  sVar20 = 8;
  if (5 < uVar16) {
    sVar20 = (size_t)(uVar16 + 2);
  }
  pVVar14->nSize = 0;
  pVVar14->nCap = (int)sVar20;
  pVVar12 = (Vec_Int_t *)calloc(sVar20,0x10);
  pVVar14->pArray = pVVar12;
  pVVar14->nSize = uVar16 + 2;
  pAVar11->vRootLits = pVVar14;
  if (vTree->nSize < 2) {
LAB_00678c59:
    if (0 < vBoxes->nSize) {
      lVar22 = 8;
      lVar26 = 0;
      do {
        qsort(*(void **)((long)&vBoxes->pArray->nCap + lVar22),
              (long)*(int *)((long)vBoxes->pArray + lVar22 + -4),4,Vec_IntSortCompare1);
        lVar26 = lVar26 + 1;
        lVar22 = lVar22 + 0x10;
      } while (lVar26 < vBoxes->nSize);
    }
    pVVar12 = Acec_TreeCarryMap(p,vAdds,vBoxes);
    lVar22 = (long)vBoxes->nSize;
    if (0 < (long)vBoxes->nSize) {
      do {
        if (vBoxes->nSize < lVar22) {
LAB_006793a2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        lVar26 = lVar22 + -1;
        pVVar15 = vBoxes->pArray;
        if (0 < pVVar15[lVar26].nSize) {
          lVar23 = 0;
          do {
            iVar3 = pVVar15[lVar26].pArray[lVar23];
            if (iVar3 < 0) goto LAB_00679364;
            uVar16 = iVar3 * 6 + 4;
            if (vAdds->nSize <= (int)uVar16) goto LAB_00679364;
            uVar16 = vAdds->pArray[uVar16];
            if (((int)uVar16 < 0) || (iVar18 <= (int)uVar16)) {
LAB_00679383:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                            ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
            }
            if ((*(uint *)((long)__s_00 + (ulong)(uVar16 >> 5) * 4) >> (uVar16 & 0x1f) & 1) == 0) {
              uVar10 = iVar3 * 6 + 2;
              if (vAdds->nSize <= (int)uVar10) goto LAB_00679364;
              Acec_TreePhases_rec(p,vAdds,pVVar12,uVar16,(uint)(vAdds->pArray[uVar10] != 0),vVisit);
            }
            lVar23 = lVar23 + 1;
          } while (lVar23 < pVVar15[lVar26].nSize);
        }
        bVar8 = 1 < lVar22;
        lVar22 = lVar26;
      } while (bVar8);
    }
    Acec_TreeVerifyPhases(p,vAdds,vBoxes);
    Acec_TreeVerifyPhases2(p,vAdds,vBoxes);
    if (__s != (int *)0x0) {
      free(__s);
      vVisit->pArray = (int *)0x0;
    }
    free(vVisit);
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
      pVVar12->pArray = (int *)0x0;
    }
    if (pVVar12 != (Vec_Int_t *)0x0) {
      free(pVVar12);
    }
    if (0 < iVar24) {
      *__s_01 = *__s_01 | 1;
      if (0 < vBoxes->nSize) {
        lVar22 = 0;
        do {
          pVVar12 = vBoxes->pArray;
          if (0 < pVVar12[lVar22].nSize) {
            uVar16 = (int)lVar22 + 1;
            lVar26 = 0;
            do {
              uVar4 = pVVar12[lVar22].pArray[lVar26];
              iVar18 = uVar4 * 6;
              uVar10 = uVar4 * 6 + 5;
              lVar23 = 0;
              do {
                if (((int)uVar4 < 0) || ((long)vAdds->nSize <= iVar18 + lVar23)) goto LAB_00679364;
                uVar5 = vAdds->pArray[iVar18 + lVar23];
                if (((int)uVar5 < 0) || (__ptr_00[1] <= (int)uVar5)) goto LAB_00679383;
                if ((*(uint *)(*(long *)(__ptr_00 + 2) + (ulong)(uVar5 >> 5) * 4) >> (uVar5 & 0x1f)
                    & 1) == 0) {
                  if (((int)uVar4 < 0) || (vAdds->nSize <= (int)uVar10)) goto LAB_00679364;
                  uVar6 = vAdds->pArray[uVar10];
                  if (pVVar13->nSize <= lVar22) {
                    uVar21 = pVVar13->nSize * 2;
                    if ((int)uVar21 <= (int)uVar16) {
                      uVar21 = uVar16;
                    }
                    if (pVVar13->nCap < (int)uVar21) {
                      if (pVVar13->pArray == (Vec_Int_t *)0x0) {
                        pVVar15 = (Vec_Int_t *)malloc((ulong)uVar21 << 4);
                      }
                      else {
                        pVVar15 = (Vec_Int_t *)realloc(pVVar13->pArray,(ulong)uVar21 << 4);
                      }
                      pVVar13->pArray = pVVar15;
                      memset(pVVar15 + pVVar13->nCap,0,
                             ((long)(int)uVar21 - (long)pVVar13->nCap) * 0x10);
                      pVVar13->nCap = uVar21;
                    }
                    pVVar13->nSize = uVar16;
                  }
                  if (pVVar13->nSize <= lVar22) goto LAB_006793a2;
                  Vec_IntPush(pVVar13->pArray + lVar22,
                              (uint)((uVar6 >> ((byte)((byte)lVar23 | 0x10) & 0x1f) & 1) != 0) +
                              uVar5 * 2);
                }
                lVar23 = lVar23 + 1;
              } while (lVar23 != 3);
              uVar10 = uVar4 * 6 + 5;
              lVar23 = 3;
              do {
                if ((iVar18 + 3 < 0) || ((long)vAdds->nSize <= (long)((ulong)(uVar4 * 6) + lVar23)))
                goto LAB_00679364;
                uVar5 = vAdds->pArray[(ulong)(uVar4 * 6) + lVar23];
                if (((int)uVar5 < 0) || (__ptr[1] <= (int)uVar5)) goto LAB_00679383;
                if ((*(uint *)(*(long *)(__ptr + 2) + (ulong)(uVar5 >> 5) * 4) >> (uVar5 & 0x1f) & 1
                    ) == 0) {
                  if (vAdds->nSize <= (int)uVar10) goto LAB_00679364;
                  uVar21 = (uint)(lVar23 == 4) + (int)lVar22;
                  uVar6 = vAdds->pArray[uVar10];
                  if (pVVar14->nSize <= (int)uVar21) {
                    uVar2 = uVar21 + 1;
                    uVar25 = pVVar14->nSize * 2;
                    if ((int)uVar25 <= (int)uVar2) {
                      uVar25 = uVar2;
                    }
                    if (pVVar14->nCap < (int)uVar25) {
                      if (pVVar14->pArray == (Vec_Int_t *)0x0) {
                        pVVar15 = (Vec_Int_t *)malloc((ulong)uVar25 << 4);
                      }
                      else {
                        pVVar15 = (Vec_Int_t *)realloc(pVVar14->pArray,(ulong)uVar25 << 4);
                      }
                      pVVar14->pArray = pVVar15;
                      memset(pVVar15 + pVVar14->nCap,0,
                             ((long)(int)uVar25 - (long)pVVar14->nCap) * 0x10);
                      pVVar14->nCap = uVar25;
                    }
                    pVVar14->nSize = uVar2;
                  }
                  if (pVVar14->nSize <= (int)uVar21) goto LAB_006793a2;
                  Vec_IntPush(pVVar14->pArray + uVar21,
                              (uint)((uVar6 >> ((byte)((byte)lVar23 | 0x10) & 0x1f) & 1) != 0) +
                              uVar5 * 2);
                }
                lVar23 = lVar23 + 1;
              } while (lVar23 != 5);
              if (vAdds->nSize <= (int)(uVar4 * 6 + 2)) goto LAB_00679364;
              if (vAdds->pArray[(ulong)uVar4 * 6 + 2] == 0) {
                uVar10 = uVar4 * 6 + 5;
                if (vAdds->nSize <= (int)uVar10) goto LAB_00679364;
                if ((*(byte *)((long)vAdds->pArray + (ulong)uVar10 * 4 + 2) & 4) != 0) {
                  if (pVVar13->nSize <= lVar22) {
                    uVar10 = pVVar13->nSize * 2;
                    if ((int)uVar10 <= (int)uVar16) {
                      uVar10 = uVar16;
                    }
                    if (pVVar13->nCap < (int)uVar10) {
                      if (pVVar13->pArray == (Vec_Int_t *)0x0) {
                        pVVar15 = (Vec_Int_t *)malloc((ulong)uVar10 << 4);
                      }
                      else {
                        pVVar15 = (Vec_Int_t *)realloc(pVVar13->pArray,(ulong)uVar10 << 4);
                      }
                      pVVar13->pArray = pVVar15;
                      memset(pVVar15 + pVVar13->nCap,0,
                             ((long)(int)uVar10 - (long)pVVar13->nCap) * 0x10);
                      pVVar13->nCap = uVar10;
                    }
                    pVVar13->nSize = uVar16;
                  }
                  if (pVVar13->nSize <= lVar22) goto LAB_006793a2;
                  Vec_IntPush(pVVar13->pArray + lVar22,1);
                }
              }
              lVar26 = lVar26 + 1;
            } while (lVar26 < pVVar12[lVar22].nSize);
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 < vBoxes->nSize);
      }
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
        free(*(void **)(__ptr_00 + 2));
        __ptr_00[2] = 0;
        __ptr_00[3] = 0;
      }
      free(__ptr_00);
      if (0 < pVVar13->nSize) {
        lVar22 = 8;
        lVar26 = 0;
        do {
          qsort(*(void **)((long)&pVVar13->pArray->nCap + lVar22),
                (long)*(int *)((long)pVVar13->pArray + lVar22 + -4),4,Vec_IntSortCompare1);
          lVar26 = lVar26 + 1;
          lVar22 = lVar22 + 0x10;
        } while (lVar26 < pVVar13->nSize);
      }
      if (0 < pVVar14->nSize) {
        lVar22 = 8;
        lVar26 = 0;
        do {
          qsort(*(void **)((long)&pVVar14->pArray->nCap + lVar22),
                (long)*(int *)((long)pVVar14->pArray + lVar22 + -4),4,Vec_IntSortCompare2);
          lVar26 = lVar26 + 1;
          lVar22 = lVar22 + 0x10;
        } while (lVar26 < pVVar14->nSize);
      }
      return pAVar11;
    }
LAB_006793c1:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                  ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
  }
  while( true ) {
    iVar3 = vTree->pArray[lVar22 + -1];
    if (iVar3 < 0) break;
    uVar10 = iVar3 * 6;
    uVar16 = vAdds->nSize;
    if (uVar16 == uVar10 || SBORROW4(uVar16,uVar10) != (int)(uVar16 + iVar3 * -6) < 0) break;
    piVar7 = vAdds->pArray;
    uVar4 = piVar7[uVar10];
    if (((int)uVar4 < 0) || (iVar18 <= (int)uVar4)) goto LAB_006793c1;
    uVar5 = vTree->pArray[lVar22];
    puVar1 = (uint *)((long)__s_00 + (ulong)(uVar4 >> 5) * 4);
    *puVar1 = *puVar1 | 1 << ((byte)uVar4 & 0x1f);
    if ((int)uVar16 <= (int)(uVar10 | 1)) break;
    uVar4 = piVar7[uVar10 | 1];
    if (((int)uVar4 < 0) || (iVar18 <= (int)uVar4)) goto LAB_006793c1;
    puVar1 = (uint *)((long)__s_00 + (ulong)(uVar4 >> 5) * 4);
    *puVar1 = *puVar1 | 1 << ((byte)uVar4 & 0x1f);
    if ((int)uVar16 <= (int)(uVar10 + 2)) break;
    uVar4 = piVar7[uVar10 + 2];
    if (((int)uVar4 < 0) || (iVar18 <= (int)uVar4)) goto LAB_006793c1;
    puVar1 = (uint *)((long)__s_00 + (ulong)(uVar4 >> 5) * 4);
    *puVar1 = *puVar1 | 1 << ((byte)uVar4 & 0x1f);
    if ((int)uVar16 <= (int)(uVar10 + 3)) break;
    uVar4 = piVar7[uVar10 + 3];
    if (((int)uVar4 < 0) || (iVar18 <= (int)uVar4)) goto LAB_006793c1;
    *(uint *)(__s_01 + (ulong)(uVar4 >> 5) * 4) =
         *(uint *)(__s_01 + (ulong)(uVar4 >> 5) * 4) | 1 << ((byte)uVar4 & 0x1f);
    if ((int)uVar16 <= (int)(uVar10 + 4)) break;
    uVar16 = piVar7[uVar10 + 4];
    if (((int)uVar16 < 0) || (iVar18 <= (int)uVar16)) goto LAB_006793c1;
    *(uint *)(__s_01 + (ulong)(uVar16 >> 5) * 4) =
         *(uint *)(__s_01 + (ulong)(uVar16 >> 5) * 4) | 1 << ((byte)uVar16 & 0x1f);
    if (vBoxes->nSize <= (int)uVar5) {
      iVar17 = uVar5 + 1;
      iVar9 = vBoxes->nSize * 2;
      if (iVar9 <= iVar17) {
        iVar9 = iVar17;
      }
      if (vBoxes->nCap < iVar9) {
        sVar20 = (long)iVar9 << 4;
        if (vBoxes->pArray == (Vec_Int_t *)0x0) {
          pVVar12 = (Vec_Int_t *)malloc(sVar20);
        }
        else {
          pVVar12 = (Vec_Int_t *)realloc(vBoxes->pArray,sVar20);
        }
        vBoxes->pArray = pVVar12;
        memset(pVVar12 + vBoxes->nCap,0,((long)iVar9 - (long)vBoxes->nCap) * 0x10);
        vBoxes->nCap = iVar9;
      }
      vBoxes->nSize = iVar17;
    }
    if (((int)uVar5 < 0) || (vBoxes->nSize <= (int)uVar5)) goto LAB_006793a2;
    Vec_IntPush(vBoxes->pArray + uVar5,iVar3);
    lVar22 = lVar22 + 2;
    if (vTree->nSize <= (int)lVar22) goto LAB_00678c59;
  }
LAB_00679364:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Acec_Box_t * Acec_CreateBox( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vTree )
{
    int MaxRank = Acec_CreateBoxMaxRank(vTree);
    Vec_Bit_t * vVisit  = Vec_BitStart( Vec_IntSize(vAdds)/6 );
    Vec_Bit_t * vIsLeaf = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vIsRoot = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel, * vMap;
    int i, j, k, Box, Rank;//, Count = 0;

    Acec_Box_t * pBox = ABC_CALLOC( Acec_Box_t, 1 );
    pBox->pGia        = p;
    pBox->vAdds       = Vec_WecStart( MaxRank + 1 );
    pBox->vLeafLits   = Vec_WecStart( MaxRank + 1 );
    pBox->vRootLits   = Vec_WecStart( MaxRank + 2 );

    // collect boxes; mark inputs/outputs
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
//        if ( 37 == Box && 6 == Rank )
//        {
//            printf( "Skipping one adder...\n" );
//            continue;
//        }
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+0), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+1), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+2), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+3), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+4), 1 );
        Vec_WecPush( pBox->vAdds, Rank, Box );
    }
    // sort each level
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
        Vec_IntSort( vLevel, 0 );

    // set phases starting from roots
    vMap = Acec_TreeCarryMap( p, vAdds, pBox->vAdds );
    Vec_WecForEachLevelReverse( pBox->vAdds, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
            if ( !Vec_BitEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+4) ) )
            {
                //printf( "Pushing phase of output %d of box %d\n", Vec_IntEntry(vAdds, 6*Box+4), Box );
                Acec_TreePhases_rec( p, vAdds, vMap, Vec_IntEntry(vAdds, 6*Box+4), Vec_IntEntry(vAdds, 6*Box+2) != 0, vVisit );
            }
    Acec_TreeVerifyPhases( p, vAdds, pBox->vAdds );
    Acec_TreeVerifyPhases2( p, vAdds, pBox->vAdds );
    Vec_BitFree( vVisit );
    Vec_IntFree( vMap );

    // collect inputs/outputs
    Vec_BitWriteEntry( vIsRoot, 0, 1 );
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, j )
        {
            for ( k = 0; k < 3; k++ )
                if ( !Vec_BitEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+k) ) )
                    Vec_WecPush( pBox->vLeafLits, i, Abc_Var2Lit(Vec_IntEntry(vAdds, 6*Box+k), Acec_SignBit2(vAdds, Box, k)) );
            for ( k = 3; k < 5; k++ )
                if ( !Vec_BitEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+k) ) )
                {
                    //if ( Vec_IntEntry(vAdds, 6*Box+k) == 10942 )
                    //{
                    //    printf( "++++++++++++ Skipping special\n" );
                    //    continue;
                    //}
                    Vec_WecPush( pBox->vRootLits, k == 4 ? i + 1 : i, Abc_Var2Lit(Vec_IntEntry(vAdds, 6*Box+k), Acec_SignBit2(vAdds, Box, k)) );
                }
            if ( Vec_IntEntry(vAdds, 6*Box+2) == 0 && Acec_SignBit2(vAdds, Box, 2) )
                Vec_WecPush( pBox->vLeafLits, i, 1 );
        }
    Vec_BitFree( vIsLeaf );
    Vec_BitFree( vIsRoot );
    // sort each level
    Vec_WecForEachLevel( pBox->vLeafLits, vLevel, i )
        Vec_IntSort( vLevel, 0 );
    Vec_WecForEachLevel( pBox->vRootLits, vLevel, i )
        Vec_IntSort( vLevel, 1 );
    //return pBox;
/*
    // push literals forward
    //Vec_WecPrint( pBox->vLeafLits, 0 );
    Vec_WecForEachLevel( pBox->vLeafLits, vLevel, i )
    {
        int This, Prev = Vec_IntEntry(vLevel, 0);
        Vec_IntForEachEntryStart( vLevel, This, j, 1 )
        {
            if ( Prev != This )
            {
                Prev = This;
                continue;
            }
            if ( i+1 >= Vec_WecSize(pBox->vLeafLits) )
                continue;
            Vec_IntPushOrder( Vec_WecEntry(pBox->vLeafLits, i+1), This );
            Vec_IntDrop( vLevel, j-- );
            Vec_IntDrop( vLevel, j-- );
            Prev = -1;
            Count++;
        }
    }
    printf( "Pushed forward %d input literals.\n", Count );
*/
    //Vec_WecPrint( pBox->vLeafLits, 0 );
    return pBox;
}